

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_mtmsrd(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *pTVar1;
  ulong uVar2;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o;
  TCGv_i32 pTVar3;
  TCGTemp *ts;
  TCGTemp *ts_00;
  ulong uVar4;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  if (ctx->pr != true) {
    pTVar1 = ctx->uc->tcg_ctx;
    if ((((ctx->base).tb)->cflags & 0x20000) != 0) {
      pTVar3 = tcg_const_i32_ppc64(pTVar1,1);
      tcg_gen_op3_ppc64(pTVar1,INDEX_op_st_i32,(TCGArg)(pTVar3 + (long)pTVar1),
                        (TCGArg)(pTVar1->cpu_env + (long)pTVar1),0xffffffffffffe3dc);
      tcg_temp_free_internal_ppc64(pTVar1,(TCGTemp *)(pTVar3 + (long)pTVar1));
    }
    if ((ctx->opcode & 0x10000) == 0) {
      uVar2 = (ctx->base).pc_next;
      tcg_ctx = ctx->uc->tcg_ctx;
      uVar4 = uVar2 & 0xffffffff;
      if (ctx->sf_mode != false) {
        uVar4 = uVar2;
      }
      tcg_gen_op2_ppc64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(cpu_nip + (long)tcg_ctx),uVar4);
      local_48 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
      local_40 = (TCGTemp *)
                 ((long)&pTVar1->pool_cur +
                 *(long *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)));
      tcg_gen_callN_ppc64(pTVar1,helper_store_msr_ppc64,(TCGTemp *)0x0,2,&local_48);
    }
    else {
      ts = tcg_temp_new_internal_ppc64(pTVar1,TCG_TYPE_I64,false);
      ts_00 = tcg_temp_new_internal_ppc64(pTVar1,TCG_TYPE_I64,false);
      tcg_gen_andi_i64_ppc64
                (pTVar1,(TCGv_i64)((long)ts - (long)pTVar1),
                 *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),0x8002);
      tcg_gen_andi_i64_ppc64(pTVar1,(TCGv_i64)((long)ts_00 - (long)pTVar1),cpu_msr,-0x8003);
      tcg_gen_op3_ppc64(pTVar1,INDEX_op_or_i64,(TCGArg)ts_00,(TCGArg)ts_00,(TCGArg)ts);
      local_48 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
      local_40 = ts_00;
      tcg_gen_callN_ppc64(pTVar1,helper_store_msr_ppc64,(TCGTemp *)0x0,2,&local_48);
      tcg_temp_free_internal_ppc64(pTVar1,ts);
      tcg_temp_free_internal_ppc64(pTVar1,ts_00);
    }
    uVar2 = (ctx->base).pc_next;
    pTVar1 = ctx->uc->tcg_ctx;
    uVar4 = uVar2 & 0xffffffff;
    if (ctx->sf_mode != false) {
      uVar4 = uVar2;
    }
    tcg_gen_op2_ppc64(pTVar1,INDEX_op_movi_i64,(TCGArg)(cpu_nip + (long)pTVar1),uVar4);
    ctx->exception = 0x200;
    return;
  }
  gen_exception_err(ctx,6,0x31);
  return;
}

Assistant:

static void gen_mtmsrd(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    CHK_SV;

    if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
        gen_io_start(tcg_ctx);
    }
    if (ctx->opcode & 0x00010000) {
        /* L=1 form only updates EE and RI */
        TCGv t0 = tcg_temp_new(tcg_ctx);
        TCGv t1 = tcg_temp_new(tcg_ctx);
        tcg_gen_andi_tl(tcg_ctx, t0, cpu_gpr[rS(ctx->opcode)],
                        (1 << MSR_RI) | (1 << MSR_EE));
        tcg_gen_andi_tl(tcg_ctx, t1, cpu_msr,
                        ~(target_ulong)((1 << MSR_RI) | (1 << MSR_EE)));
        tcg_gen_or_tl(tcg_ctx, t1, t1, t0);

        gen_helper_store_msr(tcg_ctx, tcg_ctx->cpu_env, t1);
        tcg_temp_free(tcg_ctx, t0);
        tcg_temp_free(tcg_ctx, t1);

    } else {
        /*
         * XXX: we need to update nip before the store if we enter
         *      power saving mode, we will exit the loop directly from
         *      ppc_store_msr
         */
        gen_update_nip(ctx, ctx->base.pc_next);
        gen_helper_store_msr(tcg_ctx, tcg_ctx->cpu_env, cpu_gpr[rS(ctx->opcode)]);
    }
    /* Must stop the translation as machine state (may have) changed */
    gen_stop_exception(ctx);
}